

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

string * __thiscall
pfederc::Lexer::getLineAt_abi_cxx11_(string *__return_storage_ptr__,Lexer *this,size_t lineIndex)

{
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (lineIndex <
      (ulong)((long)(this->lineIndices).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->lineIndices).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3)) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&this->fileContent);
  }
  else {
    std::__cxx11::to_string(&local_50,lineIndex);
    std::operator+(&local_30,"Out of bounds: ",&local_50);
    fatal("lexer.cpp",0x32,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::getLineAt(size_t lineIndex) const noexcept {
  if (lineIndex >= getLineIndices().size()) {
    fatal("lexer.cpp", __LINE__, "Out of bounds: " + std::to_string(lineIndex));
    return "";
  }

  size_t lineStartIndex = lineIndices[lineIndex];
  size_t lineEndIndex = lineIndex == lineIndices.size() - 1
    ? getFileContent().length() - 1 : lineIndices[lineIndex + 1] - 1;
  if (lineEndIndex > lineStartIndex
        && (fileContent[lineEndIndex] == '\r'
          || fileContent[lineEndIndex] == '\n')) {
    --lineEndIndex;
  }

  std::string result(fileContent.substr(lineStartIndex,
    lineEndIndex - lineStartIndex + 1));
  return result;
}